

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * dlpvalloc(size_t bytes)

{
  void *pvVar1;
  size_t pagesz;
  size_t bytes_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  pvVar1 = dlmemalign(mparams.page_size,
                      (bytes + mparams.page_size) - 1 & (mparams.page_size - 1 ^ 0xffffffffffffffff)
                     );
  return pvVar1;
}

Assistant:

void* dlpvalloc(size_t bytes) {
  size_t pagesz;
  ensure_initialization();
  pagesz = mparams.page_size;
  return dlmemalign(pagesz, (bytes + pagesz - SIZE_T_ONE) & ~(pagesz - SIZE_T_ONE));
}